

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelListAttribute.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::ChannelList>::readValueFrom
          (TypedAttribute<Imf_3_4::ChannelList> *this,IStream *is,int size,int version)

{
  char *pcVar1;
  char xs [4];
  size_t i;
  long lVar2;
  ostream *poVar3;
  InputExc *this_00;
  char t [4];
  bool pLinear;
  ChannelList *local_2c8;
  char b [4];
  ostream local_2b0 [376];
  char name [256];
  
  local_2c8 = &this->_value;
  do {
    Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(is,0xff,name);
    if (name[0] == '\0') {
      return;
    }
    lVar2 = 0;
    do {
      if (lVar2 == 0x100) {
        std::__cxx11::stringstream::stringstream((stringstream *)b);
        poVar3 = std::operator<<(local_2b0,"Invalid ");
        poVar3 = std::operator<<(poVar3,"channel name");
        poVar3 = std::operator<<(poVar3,": it is more than ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3," characters long.");
        this_00 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::InputExc::InputExc(this_00,(stringstream *)b);
        __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
      }
      pcVar1 = name + lVar2;
      lVar2 = lVar2 + 1;
    } while (*pcVar1 != '\0');
    (*is->_vptr_IStream[3])(is,(Channel *)b,4);
    t = b;
    Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(is,&pLinear);
    Xdr::skip<Imf_3_4::StreamIO,Imf_3_4::IStream>(is,3);
    (*is->_vptr_IStream[3])(is,(Channel *)b,4);
    xs = b;
    (*is->_vptr_IStream[3])(is,(Channel *)b,4);
    if (2 < (uint)t) {
      t[0] = '\x03';
      t[1] = '\0';
      t[2] = '\0';
      t[3] = '\0';
    }
    Channel::Channel((Channel *)b,(PixelType)t,(int)xs,(int)b,pLinear);
    ChannelList::insert(local_2c8,name,(Channel *)b);
  } while( true );
}

Assistant:

IMF_EXPORT void
ChannelListAttribute::readValueFrom (IStream& is, int size, int version)
{
    while (true)
    {
        //
        // Read name; zero length name means end of channel list
        //

        char name[Name::SIZE];
        Xdr::read<StreamIO> (is, Name::MAX_LENGTH, name);

        if (name[0] == 0) break;

        checkIsNullTerminated (name, "channel name");

        //
        // Read Channel struct
        //

        int  type;
        bool pLinear;
        int  xSampling;
        int  ySampling;

        Xdr::read<StreamIO> (is, type);
        Xdr::read<StreamIO> (is, pLinear);
        Xdr::skip<StreamIO> (is, 3);
        Xdr::read<StreamIO> (is, xSampling);
        Xdr::read<StreamIO> (is, ySampling);

        //
        // prevent invalid values being written to PixelType enum
        // by forcing all unknown types to NUM_PIXELTYPES which is also an invalid
        // pixel type, but can be used as a PixelType enum value
        // (Header::sanityCheck will throw an exception when files with invalid PixelTypes are read)
        //
        if (type != OPENEXR_IMF_INTERNAL_NAMESPACE::UINT &&
            type != OPENEXR_IMF_INTERNAL_NAMESPACE::HALF &&
            type != OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT)
        {
            type = OPENEXR_IMF_INTERNAL_NAMESPACE::NUM_PIXELTYPES;
        }

        _value.insert (
            name, Channel (PixelType (type), xSampling, ySampling, pLinear));
    }
}